

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

void __thiscall HawkTracer::client::Converter::Converter(Converter *this)

{
  allocator local_11;
  Converter *local_10;
  Converter *this_local;
  
  this->_vptr_Converter = (_func_int **)&PTR__Converter_00157bb8;
  local_10 = this;
  parser::make_unique<HawkTracer::client::TracepointMap>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&this->_mapping_klass_name,"HT_StringMappingEvent",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->_mapping_klass_id = 0;
  return;
}

Assistant:

Converter::Converter() :
    _tracepoint_map(HawkTracer::parser::make_unique<TracepointMap>()),
    _mapping_klass_name("HT_StringMappingEvent")
{
}